

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet.cpp
# Opt level: O0

int print_topk(vector<float,_std::allocator<float>_> *cls_scores,int topk)

{
  size_type sVar1;
  reference pvVar2;
  iterator iVar3;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var4;
  iterator iVar5;
  int in_ESI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int index;
  float score;
  int i_1;
  int i;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> vec;
  int size;
  float *in_stack_ffffffffffffff78;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *this;
  pair<float,_int> in_stack_ffffffffffffff80;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *this_00;
  uint in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar6;
  undefined4 in_stack_ffffffffffffff9c;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffffa0;
  pair<float,_int> local_40;
  int local_38;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_28;
  int local_10;
  int local_c;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
  local_10 = (int)sVar1;
  this_00 = &local_28;
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x125223);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](local_8,(long)local_38);
    in_stack_ffffffffffffff80 =
         std::make_pair<float_const&,int&>(in_stack_ffffffffffffff78,(int *)0x125265);
    local_40 = in_stack_ffffffffffffff80;
    pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       (&local_28,(long)local_38);
    std::pair<float,_int>::operator=(pvVar2,&local_40);
  }
  this = &local_28;
  iVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin(this);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin(this);
  _Var4 = __gnu_cxx::
          __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                       *)this_00,(difference_type)in_stack_ffffffffffffff80);
  iVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end(this);
  std::
  partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,std::greater<std::pair<float,int>>>
            (iVar3._M_current,_Var4._M_current,iVar5._M_current);
  for (iVar6 = 0; iVar6 < local_c; iVar6 = iVar6 + 1) {
    pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       (&local_28,(long)iVar6);
    in_stack_ffffffffffffff94 = pvVar2->first;
    pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       (&local_28,(long)iVar6);
    in_stack_ffffffffffffff90 = pvVar2->second;
    fprintf(_stderr,"%d = %f\n",(double)in_stack_ffffffffffffff94,(ulong)in_stack_ffffffffffffff90);
  }
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return 0;
}

Assistant:

static int print_topk(const std::vector<float>& cls_scores, int topk)
{
    // partial sort topk with index
    int size = cls_scores.size();
    std::vector<std::pair<float, int> > vec;
    vec.resize(size);
    for (int i = 0; i < size; i++)
    {
        vec[i] = std::make_pair(cls_scores[i], i);
    }

    std::partial_sort(vec.begin(), vec.begin() + topk, vec.end(),
                      std::greater<std::pair<float, int> >());

    // print topk and score
    for (int i = 0; i < topk; i++)
    {
        float score = vec[i].first;
        int index = vec[i].second;
        fprintf(stderr, "%d = %f\n", index, score);
    }

    return 0;
}